

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::RNEMD::collectData(RNEMD *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  __last;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  __last_00;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  __first;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  __first_00;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  SnapshotManager *this_00;
  Snapshot *pSVar12;
  element_type *peVar13;
  double *pdVar14;
  difference_type dVar15;
  reference pvVar16;
  reference pvVar17;
  reference pvVar18;
  reference pvVar19;
  pointer pBVar20;
  RectMatrix<double,_3U,_3U> *pRVar21;
  ulong uVar22;
  long in_RDI;
  double dVar23;
  double dVar24;
  __type_conflict _Var25;
  __type_conflict _Var26;
  uint j_1;
  RealType router;
  RealType rinner;
  uint i_2;
  RealType ePot;
  RealType boxVolume;
  vector<double,_std::allocator<double>_> nden;
  RealType dz;
  RealType den;
  RealType binVolume;
  RealType temp;
  RealType r;
  RealType z;
  Vector3d omega;
  int binCons;
  Vector3d coc;
  Vector3d posB;
  Vector3d posA;
  Atom *atom_1;
  iterator ai_1;
  RigidBody *rb_1;
  int atomBinNo_1;
  Atom *atom;
  iterator ai;
  RigidBody *rb;
  int atomBinNo;
  int k;
  int j;
  int i_1;
  Mat3x3d Ia;
  Vector3d angMom;
  Vector3d pos;
  shared_ptr<OpenMD::SPFData> spfData;
  ConstraintPairIterator cpi;
  ConstraintPair *consPair;
  AtomType *atype;
  StuntDouble *sd;
  Molecule *mol;
  iterator at;
  iterator iiter;
  MoleculeIterator miter;
  uint i;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  binTypeCounts;
  vector<int,_std::allocator<int>_> binEFieldCount;
  vector<int,_std::allocator<int>_> binCount;
  vector<int,_std::allocator<int>_> binDOF;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binEField;
  vector<double,_std::allocator<double>_> binKE;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> binI;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binL;
  vector<double,_std::allocator<double>_> binOmega;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binP;
  vector<double,_std::allocator<double>_> binMass;
  int DOF;
  Vector3d eField;
  RealType r2;
  Mat3x3d I;
  Vector3d L;
  RealType KE;
  Vector3d rPos;
  Vector3d vel;
  RealType mass;
  int typeIndex;
  int binNo;
  Vector3d u;
  RealType area;
  undefined4 in_stack_fffffffffffff358;
  int in_stack_fffffffffffff35c;
  Snapshot *in_stack_fffffffffffff360;
  undefined6 in_stack_fffffffffffff368;
  byte in_stack_fffffffffffff36e;
  byte in_stack_fffffffffffff36f;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  in_stack_fffffffffffff370;
  undefined7 in_stack_fffffffffffff378;
  undefined1 in_stack_fffffffffffff37f;
  SimInfo *in_stack_fffffffffffff380;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff388;
  undefined6 in_stack_fffffffffffff390;
  undefined1 in_stack_fffffffffffff396;
  undefined1 in_stack_fffffffffffff397;
  SelectionEvaluator *in_stack_fffffffffffff398;
  undefined7 in_stack_fffffffffffff3a0;
  undefined1 in_stack_fffffffffffff3a7;
  RNEMD *in_stack_fffffffffffff3a8;
  Vector3<double> *in_stack_fffffffffffff3c0;
  Vector3<double> *in_stack_fffffffffffff3c8;
  Vector3d *in_stack_fffffffffffff3d8;
  Snapshot *in_stack_fffffffffffff3e0;
  Molecule *in_stack_fffffffffffff3f8;
  RNEMD *in_stack_fffffffffffff458;
  bool local_b81;
  reference local_8c8 [7];
  reference local_858 [2];
  reference local_830;
  uint local_81c;
  reference local_818;
  reference local_808;
  reference local_7f8 [2];
  reference local_7d0;
  double local_7c0;
  double local_7b8;
  uint local_7ac;
  double local_7a8;
  RealType local_7a0;
  undefined8 local_790;
  vector<double,_std::allocator<double>_> local_788;
  double local_770;
  double local_768;
  double local_760;
  double local_758;
  double local_750;
  double local_748;
  undefined1 local_740 [52];
  int local_70c;
  Atom *local_630;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_628;
  Atom *local_620;
  int local_614;
  reference local_610 [2];
  reference local_5e8;
  AtomType **local_5d8;
  AtomType **local_5d0;
  AtomType **local_5c8;
  AtomType **local_5c0;
  AtomType **local_5b8;
  AtomType **local_5b0;
  AtomType **local_5a8;
  AtomType **local_5a0;
  AtomType **local_598;
  AtomType **local_590;
  AtomType **local_588;
  AtomType **local_580;
  Atom *local_560;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_558;
  Atom *local_550;
  int local_544;
  reference local_540 [5];
  RectMatrix<double,_3U,_3U> local_4e8 [2];
  uint local_424;
  uint local_420;
  int local_41c;
  RectMatrix<double,_3U,_3U> local_418;
  Vector<double,_3U> local_3d0 [6];
  __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
  local_330;
  ConstraintPair *local_328;
  AtomType *local_320;
  Atom *local_318;
  Molecule *local_310;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_308;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_300;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_2f8;
  undefined4 local_2f0;
  uint local_2ec;
  reference local_2e8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2d8;
  undefined4 local_2bc;
  vector<int,_std::allocator<int>_> local_2b8;
  undefined4 local_29c;
  vector<int,_std::allocator<int>_> local_298;
  undefined4 local_27c;
  vector<int,_std::allocator<int>_> local_278;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_258;
  undefined8 local_238;
  vector<double,_std::allocator<double>_> local_230;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> local_210;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_1f0;
  undefined8 local_1d0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_1a8;
  undefined8 local_188;
  vector<double,_std::allocator<double>_> local_180;
  int local_164;
  Vector<double,_3U> local_160;
  double local_148;
  RectMatrix<double,_3U,_3U> local_140;
  double local_e0;
  undefined1 local_c0 [24];
  double local_a8;
  int local_a0;
  int local_9c;
  RealType local_68 [13];
  
  if ((*(byte *)(in_RDI + 0x288) & 1) != 0) {
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    pSVar12 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 0x10) = pSVar12;
    Snapshot::getHmat((Snapshot *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffff360,
               (SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x345766);
    local_68[0] = getDefaultDividingArea(in_stack_fffffffffffff458);
    Utils::Accumulator<double>::add((Accumulator<double> *)(in_RDI + 0x1f50),local_68);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffff360,
               (Vector3<double> *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
    Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffff360);
    bVar8 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1608));
    if (bVar8) {
      SelectionEvaluator::evaluate(in_stack_fffffffffffff398);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_fffffffffffff370._M_current,
                 (SelectionSet *)
                 CONCAT17(in_stack_fffffffffffff36f,
                          CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
      SelectionSet::~SelectionSet((SelectionSet *)0x345837);
    }
    local_9c = 0;
    local_a0 = -1;
    local_a8 = 0.0;
    Vector3<double>::Vector3((Vector3<double> *)0x3458b4);
    Vector3<double>::Vector3((Vector3<double> *)0x3458c1);
    local_e0 = 0.0;
    Vector3<double>::Vector3((Vector3<double> *)0x3458da);
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3458e7);
    local_148 = 0.0;
    Vector3<double>::Vector3((Vector3<double> *)0x345900);
    local_164 = 0;
    local_188 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x345944);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type_conflict2 *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<double>::~allocator((allocator<double> *)0x345978);
    std::allocator<OpenMD::Vector3<double>_>::allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x3459a3);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<OpenMD::Vector3<double>_>::~allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x3459d6);
    local_1d0 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x345a0d);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type_conflict2 *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<double>::~allocator((allocator<double> *)0x345a41);
    std::allocator<OpenMD::Vector3<double>_>::allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x345a6c);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<OpenMD::Vector3<double>_>::~allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x345a9f);
    std::allocator<OpenMD::SquareMatrix3<double>_>::allocator
              ((allocator<OpenMD::SquareMatrix3<double>_> *)0x345aca);
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    vector((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> *
           )in_stack_fffffffffffff380,CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
           (allocator_type *)in_stack_fffffffffffff370._M_current);
    std::allocator<OpenMD::SquareMatrix3<double>_>::~allocator
              ((allocator<OpenMD::SquareMatrix3<double>_> *)0x345af6);
    local_238 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x345b2d);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type_conflict2 *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<double>::~allocator((allocator<double> *)0x345b61);
    std::allocator<OpenMD::Vector3<double>_>::allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x345b8c);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<OpenMD::Vector3<double>_>::~allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x345bbf);
    local_27c = 0;
    std::allocator<int>::allocator((allocator<int> *)0x345bf5);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type_conflict1 *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<int>::~allocator((allocator<int> *)0x345c29);
    local_29c = 0;
    std::allocator<int>::allocator((allocator<int> *)0x345c5f);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type_conflict1 *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<int>::~allocator((allocator<int> *)0x345c93);
    local_2bc = 0;
    std::allocator<int>::allocator((allocator<int> *)0x345cc9);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type_conflict1 *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<int>::~allocator((allocator<int> *)0x345cfd);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x345d0a);
    std::bitset<9UL>::operator[]
              ((bitset<9UL> *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
               (size_t)in_stack_fffffffffffff360);
    bVar8 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff360);
    std::bitset<9UL>::reference::~reference(&local_2e8);
    if (bVar8) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378));
      for (local_2ec = 0; local_2ec < *(uint *)(in_RDI + 0x1c20); local_2ec = local_2ec + 1) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](&local_2d8,(ulong)local_2ec);
        std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size
                  ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                   (in_RDI + 0x1f38));
        local_2f0 = 0;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffff397,
                            CONCAT16(in_stack_fffffffffffff396,in_stack_fffffffffffff390)),
                   (size_type)in_stack_fffffffffffff388,
                   (value_type_conflict1 *)in_stack_fffffffffffff380);
      }
    }
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_2f8)
    ;
    __gnu_cxx::
    __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
    ::__normal_iterator(&local_300);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
    ::__normal_iterator(&local_308);
    __gnu_cxx::
    __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
    ::__normal_iterator(&local_330);
    Snapshot::getSPFData((Snapshot *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
    local_310 = SimInfo::beginMolecule
                          (in_stack_fffffffffffff380,
                           (MoleculeIterator *)
                           CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378));
    while (local_310 != (Molecule *)0x0) {
      iVar11 = Molecule::getGlobalIndex(local_310);
      peVar13 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x346076);
      if (iVar11 != peVar13->globalID) {
        local_318 = (Atom *)Molecule::beginIntegrableObject
                                      ((Molecule *)in_stack_fffffffffffff380,
                                       (iterator *)
                                       CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378)
                                      );
        while (local_318 != (Atom *)0x0) {
          bVar8 = SelectionManager::isSelected
                            ((SelectionManager *)in_stack_fffffffffffff360,
                             (StuntDouble *)
                             CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
          if (bVar8) {
            StuntDouble::getPos((StuntDouble *)
                                CONCAT17(in_stack_fffffffffffff36f,
                                         CONCAT16(in_stack_fffffffffffff36e,
                                                  in_stack_fffffffffffff368)));
            Vector3<double>::Vector3
                      ((Vector3<double> *)in_stack_fffffffffffff360,
                       (Vector3<double> *)
                       CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
            local_9c = getBin(in_stack_fffffffffffff3a8,
                              (Vector3d *)
                              CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
            local_a8 = StuntDouble::getMass(&local_318->super_StuntDouble);
            StuntDouble::getVel((StuntDouble *)
                                CONCAT17(in_stack_fffffffffffff36f,
                                         CONCAT16(in_stack_fffffffffffff36e,
                                                  in_stack_fffffffffffff368)));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff360,
                       (Vector3<double> *)
                       CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
            StuntDouble::getPos((StuntDouble *)
                                CONCAT17(in_stack_fffffffffffff36f,
                                         CONCAT16(in_stack_fffffffffffff36e,
                                                  in_stack_fffffffffffff368)));
            OpenMD::operator-((Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff36f,
                                       CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)
                                      ),(Vector<double,_3U> *)in_stack_fffffffffffff360);
            Vector3<double>::operator=
                      ((Vector3<double> *)
                       CONCAT17(in_stack_fffffffffffff36f,
                                CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                       (Vector<double,_3U> *)in_stack_fffffffffffff360);
            dVar23 = local_a8 * 0.5;
            local_e0 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x346247);
            local_e0 = dVar23 * local_e0;
            local_164 = 3;
            bVar8 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffff360);
            if (bVar8) {
              StuntDouble::getJ((StuntDouble *)
                                CONCAT17(in_stack_fffffffffffff36f,
                                         CONCAT16(in_stack_fffffffffffff36e,
                                                  in_stack_fffffffffffff368)));
              (*(local_318->super_StuntDouble)._vptr_StuntDouble[5])(&local_418);
              bVar8 = StuntDouble::isLinear(&local_318->super_StuntDouble);
              if (bVar8) {
                local_41c = StuntDouble::linearAxis(&local_318->super_StuntDouble);
                local_420 = local_41c + 1 + ((local_41c + 1) / 3) * -3;
                local_424 = local_41c + 2 + ((local_41c + 2) / 3) * -3;
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,local_420);
                dVar23 = *pdVar14;
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,local_420);
                dVar1 = *pdVar14;
                pdVar14 = RectMatrix<double,_3U,_3U>::operator()(&local_418,local_420,local_420);
                dVar2 = *pdVar14;
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,local_424);
                dVar24 = *pdVar14;
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,local_424);
                dVar3 = *pdVar14;
                pdVar14 = RectMatrix<double,_3U,_3U>::operator()(&local_418,local_424,local_424);
                local_e0 = ((dVar23 * dVar1) / dVar2 + (dVar24 * dVar3) / *pdVar14) * 0.5 + local_e0
                ;
                local_164 = local_164 + 2;
              }
              else {
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,0);
                dVar23 = *pdVar14;
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,0);
                dVar1 = *pdVar14;
                pdVar14 = RectMatrix<double,_3U,_3U>::operator()(&local_418,0,0);
                dVar2 = *pdVar14;
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,1);
                dVar24 = *pdVar14;
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,1);
                dVar3 = *pdVar14;
                pdVar14 = RectMatrix<double,_3U,_3U>::operator()(&local_418,1,1);
                dVar4 = *pdVar14;
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,2);
                dVar5 = *pdVar14;
                pdVar14 = Vector<double,_3U>::operator[](local_3d0,2);
                dVar6 = *pdVar14;
                pdVar14 = RectMatrix<double,_3U,_3U>::operator()(&local_418,2,2);
                local_e0 = ((dVar23 * dVar1) / dVar2 + (dVar24 * dVar3) / dVar4 +
                           (dVar5 * dVar6) / *pdVar14) * 0.5 + local_e0;
                local_164 = local_164 + 3;
              }
              SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3467a8);
            }
            cross<double>(in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
            OpenMD::operator*((double)CONCAT17(in_stack_fffffffffffff36f,
                                               CONCAT16(in_stack_fffffffffffff36e,
                                                        in_stack_fffffffffffff368)),
                              (Vector<double,_3U> *)in_stack_fffffffffffff360);
            Vector3<double>::operator=
                      ((Vector3<double> *)
                       CONCAT17(in_stack_fffffffffffff36f,
                                CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                       (Vector<double,_3U> *)in_stack_fffffffffffff360);
            outProduct<double>((Vector3<double> *)in_stack_fffffffffffff388,
                               (Vector3<double> *)in_stack_fffffffffffff380);
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)
                              CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
                              (double)in_stack_fffffffffffff370._M_current);
            SquareMatrix<double,_3>::SquareMatrix
                      ((SquareMatrix<double,_3> *)in_stack_fffffffffffff360,
                       (RectMatrix<double,_3U,_3U> *)
                       CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
            SquareMatrix3<double>::operator=
                      ((SquareMatrix3<double> *)
                       CONCAT17(in_stack_fffffffffffff36f,
                                CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                       (SquareMatrix<double,_3> *)in_stack_fffffffffffff360);
            SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x346885);
            RectMatrix<double,_3U,_3U>::~RectMatrix(local_4e8);
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x34689f);
            dVar24 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x3468ac);
            dVar1 = local_a8;
            local_148 = dVar24;
            pdVar14 = RectMatrix<double,_3U,_3U>::operator()(&local_140,0,0);
            dVar2 = local_a8;
            dVar23 = local_148;
            *pdVar14 = dVar1 * dVar24 + *pdVar14;
            pdVar14 = RectMatrix<double,_3U,_3U>::operator()(&local_140,1,1);
            dVar24 = local_a8;
            dVar1 = local_148;
            *pdVar14 = dVar2 * dVar23 + *pdVar14;
            pdVar14 = RectMatrix<double,_3U,_3U>::operator()(&local_140,2,2);
            *pdVar14 = dVar24 * dVar1 + *pdVar14;
            std::bitset<9UL>::operator[]
                      ((bitset<9UL> *)
                       CONCAT17(in_stack_fffffffffffff36f,
                                CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                       (size_t)in_stack_fffffffffffff360);
            bVar8 = std::bitset::reference::operator_cast_to_bool
                              ((reference *)in_stack_fffffffffffff360);
            std::bitset<9UL>::reference::~reference(local_540);
            if (bVar8) {
              bVar8 = StuntDouble::isRigidBody(&local_318->super_StuntDouble);
              if (bVar8) {
                local_550 = local_318;
                __gnu_cxx::
                __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                ::__normal_iterator(&local_558);
                local_560 = RigidBody::beginAtom
                                      ((RigidBody *)in_stack_fffffffffffff380,
                                       (iterator *)
                                       CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378)
                                      );
                while (local_560 != (Atom *)0x0) {
                  local_a0 = -1;
                  StuntDouble::getPos((StuntDouble *)
                                      CONCAT17(in_stack_fffffffffffff36f,
                                               CONCAT16(in_stack_fffffffffffff36e,
                                                        in_stack_fffffffffffff368)));
                  local_544 = getBin(in_stack_fffffffffffff3a8,
                                     (Vector3d *)
                                     CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
                  local_320 = Atom::getAtomType(local_560);
                  local_588 = (AtomType **)
                              std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::
                              begin((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                     *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358)
                                   );
                  local_590 = (AtomType **)
                              std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::
                              end((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *
                                  )CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
                  __first._M_current._7_1_ = in_stack_fffffffffffff37f;
                  __first._M_current._0_7_ = in_stack_fffffffffffff378;
                  local_580 = (AtomType **)
                              std::
                              find<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>,OpenMD::AtomType*>
                                        (__first,in_stack_fffffffffffff370,
                                         (AtomType **)
                                         CONCAT17(in_stack_fffffffffffff36f,
                                                  CONCAT16(in_stack_fffffffffffff36e,
                                                           in_stack_fffffffffffff368)));
                  local_308 = (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                               )local_580;
                  local_598 = (AtomType **)
                              std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::
                              end((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *
                                  )CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
                  bVar8 = __gnu_cxx::operator!=
                                    ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                      *)in_stack_fffffffffffff360,
                                     (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358
                                                ));
                  if (bVar8) {
                    local_5a0 = (AtomType **)
                                std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                ::begin((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                         *)CONCAT44(in_stack_fffffffffffff35c,
                                                    in_stack_fffffffffffff358));
                    local_5a8 = local_308._M_current;
                    __last._M_current._6_1_ = in_stack_fffffffffffff36e;
                    __last._M_current._0_6_ = in_stack_fffffffffffff368;
                    __last._M_current._7_1_ = in_stack_fffffffffffff36f;
                    dVar15 = std::
                             distance<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>>
                                       (in_stack_fffffffffffff370,__last);
                    local_a0 = (int)dVar15;
                  }
                  if (((-1 < local_544) && (local_544 < *(int *)(in_RDI + 0x1c20))) &&
                     (local_a0 != -1)) {
                    pvVar16 = std::
                              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ::operator[](&local_2d8,(long)local_544);
                    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                                        (pvVar16,(long)local_a0);
                    *pvVar18 = *pvVar18 + 1;
                  }
                  local_560 = RigidBody::nextAtom((RigidBody *)in_stack_fffffffffffff380,
                                                  (iterator *)
                                                  CONCAT17(in_stack_fffffffffffff37f,
                                                           in_stack_fffffffffffff378));
                }
              }
              else {
                bVar8 = StuntDouble::isAtom(&local_318->super_StuntDouble);
                if (bVar8) {
                  local_a0 = -1;
                  local_320 = Atom::getAtomType(local_318);
                  local_5b8 = (AtomType **)
                              std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::
                              begin((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                     *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358)
                                   );
                  local_5c0 = (AtomType **)
                              std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::
                              end((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *
                                  )CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
                  __first_00._M_current._7_1_ = in_stack_fffffffffffff37f;
                  __first_00._M_current._0_7_ = in_stack_fffffffffffff378;
                  local_5b0 = (AtomType **)
                              std::
                              find<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>,OpenMD::AtomType*>
                                        (__first_00,in_stack_fffffffffffff370,
                                         (AtomType **)
                                         CONCAT17(in_stack_fffffffffffff36f,
                                                  CONCAT16(in_stack_fffffffffffff36e,
                                                           in_stack_fffffffffffff368)));
                  local_308 = (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                               )local_5b0;
                  local_5c8 = (AtomType **)
                              std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::
                              end((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *
                                  )CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
                  bVar8 = __gnu_cxx::operator!=
                                    ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                      *)in_stack_fffffffffffff360,
                                     (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358
                                                ));
                  if (bVar8) {
                    local_5d0 = (AtomType **)
                                std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                ::begin((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                         *)CONCAT44(in_stack_fffffffffffff35c,
                                                    in_stack_fffffffffffff358));
                    local_5d8 = local_308._M_current;
                    __last_00._M_current._6_1_ = in_stack_fffffffffffff36e;
                    __last_00._M_current._0_6_ = in_stack_fffffffffffff368;
                    __last_00._M_current._7_1_ = in_stack_fffffffffffff36f;
                    dVar15 = std::
                             distance<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>>
                                       (in_stack_fffffffffffff370,__last_00);
                    local_a0 = (int)dVar15;
                  }
                  if ((-1 < local_9c) && (local_9c < *(int *)(in_RDI + 0x1c20))) {
                    std::bitset<9UL>::operator[]
                              ((bitset<9UL> *)
                               CONCAT17(in_stack_fffffffffffff36f,
                                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368
                                                )),(size_t)in_stack_fffffffffffff360);
                    local_b81 = std::bitset::reference::operator_cast_to_bool
                                          ((reference *)in_stack_fffffffffffff360);
                    local_b81 = local_b81 && local_a0 != -1;
                    std::bitset<9UL>::reference::~reference(&local_5e8);
                    if (local_b81) {
                      pvVar16 = std::
                                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ::operator[](&local_2d8,(long)local_9c);
                      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                                          (pvVar16,(long)local_a0);
                      *pvVar18 = *pvVar18 + 1;
                    }
                  }
                }
              }
            }
            if ((-1 < local_9c) && (local_9c < *(int *)(in_RDI + 0x1c20))) {
              pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_298,(long)local_9c);
              dVar23 = local_a8;
              *pvVar18 = *pvVar18 + 1;
              pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_180,(long)local_9c);
              *pvVar17 = *pvVar17 + dVar23;
              OpenMD::operator*((double)CONCAT17(in_stack_fffffffffffff36f,
                                                 CONCAT16(in_stack_fffffffffffff36e,
                                                          in_stack_fffffffffffff368)),
                                (Vector<double,_3U> *)in_stack_fffffffffffff360);
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              operator[](&local_1a8,(long)local_9c);
              Vector<double,_3U>::operator+=
                        ((Vector<double,_3U> *)in_stack_fffffffffffff360,
                         (Vector<double,_3U> *)
                         CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
              dVar23 = local_e0;
              pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_230,(long)local_9c);
              *pvVar17 = *pvVar17 + dVar23;
              std::
              vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              ::operator[](&local_210,(long)local_9c);
              RectMatrix<double,_3U,_3U>::operator+=
                        ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff360,
                         (RectMatrix<double,_3U,_3U> *)
                         CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              operator[](&local_1f0,(long)local_9c);
              Vector<double,_3U>::operator+=
                        ((Vector<double,_3U> *)in_stack_fffffffffffff360,
                         (Vector<double,_3U> *)
                         CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
              iVar11 = local_164;
              pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_278,(long)local_9c);
              *pvVar18 = iVar11 + *pvVar18;
            }
          }
          std::bitset<9UL>::operator[]
                    ((bitset<9UL> *)
                     CONCAT17(in_stack_fffffffffffff36f,
                              CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                     (size_t)in_stack_fffffffffffff360);
          bVar8 = std::bitset::reference::operator_cast_to_bool
                            ((reference *)in_stack_fffffffffffff360);
          std::bitset<9UL>::reference::~reference(local_610);
          if (bVar8) {
            bVar8 = StuntDouble::isRigidBody(&local_318->super_StuntDouble);
            if (bVar8) {
              local_620 = local_318;
              __gnu_cxx::
              __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
              ::__normal_iterator(&local_628);
              local_630 = RigidBody::beginAtom
                                    ((RigidBody *)in_stack_fffffffffffff380,
                                     (iterator *)
                                     CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378));
              while (local_630 != (Atom *)0x0) {
                StuntDouble::getPos((StuntDouble *)
                                    CONCAT17(in_stack_fffffffffffff36f,
                                             CONCAT16(in_stack_fffffffffffff36e,
                                                      in_stack_fffffffffffff368)));
                local_614 = getBin(in_stack_fffffffffffff3a8,
                                   (Vector3d *)
                                   CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
                StuntDouble::getElectricField
                          ((StuntDouble *)
                           CONCAT17(in_stack_fffffffffffff36f,
                                    CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
                Vector3<double>::operator=
                          ((Vector3<double> *)in_stack_fffffffffffff360,
                           (Vector3<double> *)
                           CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
                if ((-1 < local_614) && (local_614 < *(int *)(in_RDI + 0x1c20))) {
                  pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_2b8,(long)local_614);
                  *pvVar18 = *pvVar18 + 1;
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  operator[](&local_258,(long)local_614);
                  Vector<double,_3U>::operator+=
                            ((Vector<double,_3U> *)in_stack_fffffffffffff360,
                             (Vector<double,_3U> *)
                             CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
                }
                local_630 = RigidBody::nextAtom((RigidBody *)in_stack_fffffffffffff380,
                                                (iterator *)
                                                CONCAT17(in_stack_fffffffffffff37f,
                                                         in_stack_fffffffffffff378));
              }
            }
            else {
              StuntDouble::getElectricField
                        ((StuntDouble *)
                         CONCAT17(in_stack_fffffffffffff36f,
                                  CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_fffffffffffff360,
                         (Vector3<double> *)
                         CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
              StuntDouble::getPos((StuntDouble *)
                                  CONCAT17(in_stack_fffffffffffff36f,
                                           CONCAT16(in_stack_fffffffffffff36e,
                                                    in_stack_fffffffffffff368)));
              local_614 = getBin(in_stack_fffffffffffff3a8,
                                 (Vector3d *)
                                 CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
              if ((-1 < local_614) && (local_614 < *(int *)(in_RDI + 0x1c20))) {
                pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_2b8,(long)local_614);
                *pvVar18 = *pvVar18 + 1;
                std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                operator[](&local_258,(long)local_614);
                Vector<double,_3U>::operator+=
                          ((Vector<double,_3U> *)in_stack_fffffffffffff360,
                           (Vector<double,_3U> *)
                           CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
              }
            }
          }
          local_318 = (Atom *)Molecule::nextIntegrableObject
                                        ((Molecule *)in_stack_fffffffffffff380,
                                         (iterator *)
                                         CONCAT17(in_stack_fffffffffffff37f,
                                                  in_stack_fffffffffffff378));
        }
        bVar8 = SelectionManager::isSelected
                          ((SelectionManager *)in_stack_fffffffffffff360,
                           (Molecule *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358)
                          );
        if (bVar8) {
          local_328 = Molecule::beginConstraintPair
                                ((Molecule *)in_stack_fffffffffffff380,
                                 (iterator *)
                                 CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378));
          while (local_328 != (ConstraintPair *)0x0) {
            ConstraintPair::getConsElem1(local_328);
            ConstraintElem::getPos
                      ((ConstraintElem *)
                       CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
            ConstraintPair::getConsElem2(local_328);
            ConstraintElem::getPos
                      ((ConstraintElem *)
                       CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
            if ((*(byte *)(in_RDI + 0x289) & 1) != 0) {
              Snapshot::wrapVector(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
              Snapshot::wrapVector(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
            }
            OpenMD::operator+((Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff36f,
                                       CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)
                                      ),(Vector<double,_3U> *)in_stack_fffffffffffff360);
            OpenMD::operator*((double)CONCAT17(in_stack_fffffffffffff36f,
                                               CONCAT16(in_stack_fffffffffffff36e,
                                                        in_stack_fffffffffffff368)),
                              (Vector<double,_3U> *)in_stack_fffffffffffff360);
            Vector3<double>::Vector3
                      ((Vector3<double> *)in_stack_fffffffffffff360,
                       (Vector<double,_3U> *)
                       CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
            Vector3<double>::Vector3
                      ((Vector3<double> *)in_stack_fffffffffffff360,
                       (Vector3<double> *)
                       CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
            local_70c = getBin(in_stack_fffffffffffff3a8,
                               (Vector3d *)
                               CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
            pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&local_278,(long)local_70c)
            ;
            *pvVar18 = *pvVar18 + -1;
            local_328 = Molecule::nextConstraintPair
                                  ((Molecule *)in_stack_fffffffffffff380,
                                   (iterator *)
                                   CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378));
          }
        }
      }
      in_stack_fffffffffffff3f8 =
           SimInfo::nextMolecule
                     (in_stack_fffffffffffff380,
                      (MoleculeIterator *)
                      CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378));
      local_310 = in_stack_fffffffffffff3f8;
    }
    Vector3<double>::Vector3((Vector3<double> *)0x34767c);
    local_768 = 0.0;
    local_770 = 0.0;
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)(in_RDI + 0x1f38))
    ;
    local_790 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x3476d3);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff380,
               CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
               (value_type_conflict2 *)in_stack_fffffffffffff370._M_current,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff36f,
                        CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)));
    std::allocator<double>::~allocator((allocator<double> *)0x347707);
    local_7a0 = Snapshot::getVolume(in_stack_fffffffffffff360);
    local_7a8 = 0.0;
    for (local_7ac = 0; local_7ac < *(uint *)(in_RDI + 0x1c20); local_7ac = local_7ac + 1) {
      if ((*(byte *)(in_RDI + 0x289) & 1) == 0) {
        local_750 = ((double)local_7ac + 0.5) * *(double *)(in_RDI + 0x1c28);
        pvVar19 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),1);
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&pvVar19->accumulator,(ulong)local_7ac);
        pBVar20 = std::
                  unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                  ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                *)0x34794e);
        (*pBVar20->_vptr_BaseAccumulator[2])(local_750);
        local_7b8 = (double)local_7ac * *(double *)(in_RDI + 0x1c28);
        local_7c0 = (double)(local_7ac + 1) * *(double *)(in_RDI + 0x1c28);
        _Var25 = std::pow<double,int>((double)in_stack_fffffffffffff360,in_stack_fffffffffffff35c);
        _Var26 = std::pow<double,int>((double)in_stack_fffffffffffff360,in_stack_fffffffffffff35c);
        local_760 = ((_Var25 - _Var26) * 12.566370614359172) / 3.0;
      }
      else {
        uVar22 = (ulong)local_7ac;
        uVar7 = *(uint *)(in_RDI + 0x1c20);
        pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                            ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x18),*(uint *)(in_RDI + 0x240)
                             ,*(uint *)(in_RDI + 0x240));
        local_748 = (((double)uVar22 + 0.5) / (double)uVar7) * *pdVar14;
        pvVar19 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),0);
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&pvVar19->accumulator,(ulong)local_7ac);
        pBVar20 = std::
                  unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                  ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                *)0x347823);
        (*pBVar20->_vptr_BaseAccumulator[2])(local_748);
        local_760 = local_7a0 / (double)*(uint *)(in_RDI + 0x1c20);
        pdVar14 = RectMatrix<double,_3U,_3U>::operator()
                            ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x18),*(uint *)(in_RDI + 0x240)
                             ,*(uint *)(in_RDI + 0x240));
        local_770 = *pdVar14 / (double)*(uint *)(in_RDI + 0x1c20);
      }
      std::bitset<9UL>::operator[]
                ((bitset<9UL> *)
                 CONCAT17(in_stack_fffffffffffff36f,
                          CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                 (size_t)in_stack_fffffffffffff360);
      bVar9 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff360);
      bVar8 = false;
      if (bVar9) {
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&local_2b8,(ulong)local_7ac);
        bVar8 = 0 < *pvVar18;
      }
      std::bitset<9UL>::reference::~reference(&local_7d0);
      if (bVar8) {
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (&local_258,(ulong)local_7ac);
        std::vector<int,_std::allocator<int>_>::operator[](&local_2b8,(ulong)local_7ac);
        operator/((Vector<double,_3U> *)
                  CONCAT17(in_stack_fffffffffffff36f,
                           CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                  (double)in_stack_fffffffffffff360);
        Vector3<double>::operator=
                  ((Vector3<double> *)
                   CONCAT17(in_stack_fffffffffffff36f,
                            CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                   (Vector<double,_3U> *)in_stack_fffffffffffff360);
        pvVar19 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),7);
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&pvVar19->accumulator,(ulong)local_7ac);
        pBVar20 = std::
                  unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                  ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                *)0x347b2f);
        (*pBVar20->_vptr_BaseAccumulator[4])(pBVar20,&local_160);
      }
      std::bitset<9UL>::operator[]
                ((bitset<9UL> *)
                 CONCAT17(in_stack_fffffffffffff36f,
                          CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                 (size_t)in_stack_fffffffffffff360);
      bVar10 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff360)
      ;
      std::bitset<9UL>::reference::~reference(local_7f8);
      if ((((bVar10 & 1) != 0) && ((*(byte *)(in_RDI + 0x289) & 1) != 0)) &&
         (pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&local_2b8,(ulong)local_7ac),
         0 < *pvVar18)) {
        pdVar14 = Vector<double,_3U>::operator[](&local_160,*(uint *)(in_RDI + 0x240));
        local_7a8 = *pdVar14 * local_770 + local_7a8;
        pvVar19 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),8);
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&pvVar19->accumulator,(ulong)local_7ac);
        pBVar20 = std::
                  unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                  ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                *)0x347c4d);
        (*pBVar20->_vptr_BaseAccumulator[2])(local_7a8);
      }
      std::bitset<9UL>::operator[]
                ((bitset<9UL> *)
                 CONCAT17(in_stack_fffffffffffff36f,
                          CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                 (size_t)in_stack_fffffffffffff360);
      bVar10 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff360)
      ;
      std::bitset<9UL>::reference::~reference(&local_808);
      if ((bVar10 & 1) != 0) {
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&local_180,(ulong)local_7ac);
        local_768 = (*pvVar17 * 1.66053886) / local_760;
        pvVar19 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),5);
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&pvVar19->accumulator,(ulong)local_7ac);
        pBVar20 = std::
                  unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                  ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                *)0x347d28);
        (*pBVar20->_vptr_BaseAccumulator[2])(local_768);
      }
      std::bitset<9UL>::operator[]
                ((bitset<9UL> *)
                 CONCAT17(in_stack_fffffffffffff36f,
                          CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                 (size_t)in_stack_fffffffffffff360);
      bVar10 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff360)
      ;
      std::bitset<9UL>::reference::~reference(&local_818);
      if ((bVar10 & 1) != 0) {
        local_81c = 0;
        while( true ) {
          in_stack_fffffffffffff388 = (RectMatrix<double,_3U,_3U> *)(ulong)local_81c;
          pRVar21 = (RectMatrix<double,_3U,_3U> *)
                    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size
                              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                               (in_RDI + 0x1f38));
          if (pRVar21 <= in_stack_fffffffffffff388) break;
          pvVar16 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&local_2d8,(ulong)local_7ac);
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](pvVar16,(ulong)local_81c);
          in_stack_fffffffffffff380 = (SimInfo *)(((double)*pvVar18 / local_760) * 1660.5390404272);
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&local_788,(ulong)local_81c);
          *pvVar17 = (value_type)in_stack_fffffffffffff380;
          local_81c = local_81c + 1;
        }
        pvVar19 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),6);
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&pvVar19->accumulator,(ulong)local_7ac);
        pBVar20 = std::
                  unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                  ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                *)0x347e79);
        (*pBVar20->_vptr_BaseAccumulator[3])(pBVar20,&local_788);
      }
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&local_298,(ulong)local_7ac);
      if (0 < *pvVar18) {
        std::bitset<9UL>::operator[]
                  ((bitset<9UL> *)
                   CONCAT17(in_stack_fffffffffffff36f,
                            CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                   (size_t)in_stack_fffffffffffff360);
        bVar10 = std::bitset::reference::operator_cast_to_bool
                           ((reference *)in_stack_fffffffffffff360);
        std::bitset<9UL>::reference::~reference(&local_830);
        if ((bVar10 & 1) != 0) {
          in_stack_fffffffffffff370._M_current =
               (AtomType **)
               std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[](&local_1a8,(ulong)local_7ac);
          std::vector<double,_std::allocator<double>_>::operator[](&local_180,(ulong)local_7ac);
          operator/((Vector<double,_3U> *)
                    CONCAT17(in_stack_fffffffffffff36f,
                             CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                    (double)in_stack_fffffffffffff360);
          Vector3<double>::operator=
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff36f,
                              CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                     (Vector<double,_3U> *)in_stack_fffffffffffff360);
          pvVar19 = std::
                    vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                    ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                  *)(in_RDI + 0x1f20),3);
          std::
          vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
          ::operator[](&pvVar19->accumulator,(ulong)local_7ac);
          pBVar20 = std::
                    unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                    ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                  *)0x347f94);
          (*pBVar20->_vptr_BaseAccumulator[4])(pBVar20,local_c0);
        }
        std::bitset<9UL>::operator[]
                  ((bitset<9UL> *)
                   CONCAT17(in_stack_fffffffffffff36f,
                            CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                   (size_t)in_stack_fffffffffffff360);
        in_stack_fffffffffffff36f =
             std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff360);
        std::bitset<9UL>::reference::~reference(local_858);
        if ((in_stack_fffffffffffff36f & 1) != 0) {
          std::
          vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
          operator[](&local_210,(ulong)local_7ac);
          SquareMatrix3<double>::inverse((SquareMatrix3<double> *)in_stack_fffffffffffff3f8);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[](&local_1f0,(ulong)local_7ac);
          OpenMD::operator*(in_stack_fffffffffffff388,
                            (Vector<double,_3U> *)in_stack_fffffffffffff380);
          Vector3<double>::operator=
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff36f,
                              CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                     (Vector<double,_3U> *)in_stack_fffffffffffff360);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x348076);
          pvVar19 = std::
                    vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                    ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                  *)(in_RDI + 0x1f20),4);
          std::
          vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
          ::operator[](&pvVar19->accumulator,(ulong)local_7ac);
          pBVar20 = std::
                    unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                    ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                  *)0x3480ac);
          (*pBVar20->_vptr_BaseAccumulator[4])(pBVar20,local_740);
        }
        std::bitset<9UL>::operator[]
                  ((bitset<9UL> *)
                   CONCAT17(in_stack_fffffffffffff36f,
                            CONCAT16(in_stack_fffffffffffff36e,in_stack_fffffffffffff368)),
                   (size_t)in_stack_fffffffffffff360);
        in_stack_fffffffffffff36e =
             std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff360);
        std::bitset<9UL>::reference::~reference(local_8c8);
        if ((in_stack_fffffffffffff36e & 1) != 0) {
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&local_278,(ulong)local_7ac);
          if (*pvVar18 < 1) {
            std::operator<<((ostream *)&std::cerr,"No degrees of freedom in this bin?\n");
          }
          else {
            pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&local_230,(ulong)local_7ac);
            in_stack_fffffffffffff360 = (Snapshot *)(*pvVar17 + *pvVar17);
            pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&local_278,(ulong)local_7ac);
            local_758 = (double)in_stack_fffffffffffff360 /
                        ((double)*pvVar18 * 0.0019872156 * 0.0004184);
            pvVar19 = std::
                      vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                      ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                    *)(in_RDI + 0x1f20),2);
            std::
            vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
            ::operator[](&pvVar19->accumulator,(ulong)local_7ac);
            pBVar20 = std::
                      unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                      ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                    *)0x3481f6);
            (*pBVar20->_vptr_BaseAccumulator[2])(local_758);
          }
        }
      }
    }
    *(undefined1 *)(in_RDI + 0x1c60) = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff370._M_current);
    std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x34826b);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffff370._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff370._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff370._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff370._M_current);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff370._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff370._M_current);
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    ~vector((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             *)in_stack_fffffffffffff370._M_current);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff370._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff370._M_current);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff370._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff370._M_current);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x348307);
  }
  return;
}

Assistant:

void RNEMD::collectData() {
    if (!doRNEMD_) return;
    currentSnap_ = info_->getSnapshotManager()->getCurrentSnapshot();
    hmat_        = currentSnap_->getHmat();

    // collectData() can be called more frequently than the doRNEMD(), so use
    // the computed area from the last exchange time:
    RealType area = getDefaultDividingArea();
    areaAccumulator_.add(area);

    Vector3d u = angularMomentumFluxVector_;
    u.normalize();

    // throw an error if isDynamic instead?
    if (outputEvaluator_.isDynamic()) {
      outputSeleMan_.setSelectionSet(outputEvaluator_.evaluate());
    }

    int binNo {};
    int typeIndex(-1);
    RealType mass {};
    Vector3d vel {};
    Vector3d rPos {};
    RealType KE {};
    Vector3d L {};
    Mat3x3d I {};
    RealType r2 {};
    Vector3d eField {};
    int DOF {};

    vector<RealType> binMass(nBins_, 0.0);
    vector<Vector3d> binP(nBins_, V3Zero);
    vector<RealType> binOmega(nBins_, 0.0);
    vector<Vector3d> binL(nBins_, V3Zero);
    vector<Mat3x3d> binI(nBins_);
    vector<RealType> binKE(nBins_, 0.0);
    vector<Vector3d> binEField(nBins_, V3Zero);
    vector<int> binDOF(nBins_, 0);
    vector<int> binCount(nBins_, 0);
    vector<int> binEFieldCount(nBins_, 0);
    vector<vector<int>> binTypeCounts;

    if (outputMask_[ACTIVITY]) {
      binTypeCounts.resize(nBins_);
      for (unsigned int i = 0; i < nBins_; i++) {
        binTypeCounts[i].resize(outputTypes_.size(), 0);
      }
    }

    SimInfo::MoleculeIterator miter;
    std::vector<StuntDouble*>::iterator iiter;
    std::vector<AtomType*>::iterator at;
    Molecule* mol;
    StuntDouble* sd;
    AtomType* atype;
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;

    std::shared_ptr<SPFData> spfData = currentSnap_->getSPFData();

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      if (mol->getGlobalIndex() == spfData->globalID) { continue; }

      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        if (outputSeleMan_.isSelected(sd)) {
          Vector3d pos = sd->getPos();
          binNo        = getBin(pos);

          mass = sd->getMass();
          vel  = sd->getVel();
          rPos = sd->getPos() - coordinateOrigin_;
          KE   = 0.5 * mass * vel.lengthSquare();
          DOF  = 3;

          if (sd->isDirectional()) {
            Vector3d angMom = sd->getJ();
            Mat3x3d Ia      = sd->getI();
            if (sd->isLinear()) {
              int i = sd->linearAxis();
              int j = (i + 1) % 3;
              int k = (i + 2) % 3;
              KE += 0.5 * (angMom[j] * angMom[j] / Ia(j, j) +
                           angMom[k] * angMom[k] / Ia(k, k));
              DOF += 2;
            } else {
              KE += 0.5 * (angMom[0] * angMom[0] / Ia(0, 0) +
                           angMom[1] * angMom[1] / Ia(1, 1) +
                           angMom[2] * angMom[2] / Ia(2, 2));
              DOF += 3;
            }
          }

          L  = mass * cross(rPos, vel);
          I  = outProduct(rPos, rPos) * mass;
          r2 = rPos.lengthSquare();
          I(0, 0) += mass * r2;
          I(1, 1) += mass * r2;
          I(2, 2) += mass * r2;

          if (outputMask_[ACTIVITY]) {
            if (sd->isRigidBody()) {
              int atomBinNo;
              RigidBody* rb = static_cast<RigidBody*>(sd);
              std::vector<Atom*>::iterator ai;
              Atom* atom;
              for (atom = rb->beginAtom(ai); atom != NULL;
                   atom = rb->nextAtom(ai)) {
                typeIndex = -1;
                atomBinNo = getBin(atom->getPos());

                atype = static_cast<Atom*>(atom)->getAtomType();
                at = std::find(outputTypes_.begin(), outputTypes_.end(), atype);
                if (at != outputTypes_.end()) {
                  typeIndex = std::distance(outputTypes_.begin(), at);
                }

                if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
                  if (typeIndex != -1) binTypeCounts[atomBinNo][typeIndex]++;
                }
              }
            } else if (sd->isAtom()) {
              typeIndex = -1;
              atype     = static_cast<Atom*>(sd)->getAtomType();
              at = std::find(outputTypes_.begin(), outputTypes_.end(), atype);
              if (at != outputTypes_.end()) {
                typeIndex = std::distance(outputTypes_.begin(), at);
              }

              if (binNo >= 0 && binNo < int(nBins_)) {
                if (outputMask_[ACTIVITY] && typeIndex != -1)
                  binTypeCounts[binNo][typeIndex]++;
              }
            }
          }

          if (binNo >= 0 && binNo < int(nBins_)) {
            binCount[binNo]++;
            binMass[binNo] += mass;
            binP[binNo] += mass * vel;
            binKE[binNo] += KE;
            binI[binNo] += I;
            binL[binNo] += L;
            binDOF[binNo] += DOF;
          }
        }

        // Calculate the electric field (kcal/mol/e/Angstrom) for all atoms
        // in the box
        if (outputMask_[ELECTRICFIELD]) {
          int atomBinNo;
          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            std::vector<Atom*>::iterator ai;
            Atom* atom;
            for (atom = rb->beginAtom(ai); atom != NULL;
                 atom = rb->nextAtom(ai)) {
              atomBinNo = getBin(atom->getPos());
              eField    = atom->getElectricField();

              if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
                binEFieldCount[atomBinNo]++;
                binEField[atomBinNo] += eField;
              }
            }
          } else {
            eField    = sd->getElectricField();
            atomBinNo = getBin(sd->getPos());

            if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
              binEFieldCount[atomBinNo]++;
              binEField[atomBinNo] += eField;
            }
          }
        }
      }

      // we need to subtract out degrees of freedom from constraints
      // belonging in this bin:
      if (outputSeleMan_.isSelected(mol)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          Vector3d posA = consPair->getConsElem1()->getPos();
          Vector3d posB = consPair->getConsElem2()->getPos();

          if (usePeriodicBoundaryConditions_) {
            currentSnap_->wrapVector(posA);
            currentSnap_->wrapVector(posB);
          }

          Vector3d coc = 0.5 * (posA + posB);
          int binCons  = getBin(coc);
          binDOF[binCons] -= 1;
        }
      }
    }

#ifdef IS_MPI
    for (unsigned int i = 0; i < nBins_; i++) {
      MPI_Allreduce(MPI_IN_PLACE, &binCount[i], 1, MPI_INT, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binMass[i], 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binP[i].getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binL[i].getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binI[i].getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binKE[i], 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binDOF[i], 1, MPI_INT, MPI_SUM,
                    MPI_COMM_WORLD);

      if (outputMask_[ELECTRICFIELD]) {
        MPI_Allreduce(MPI_IN_PLACE, &binEFieldCount[i], 1, MPI_INT, MPI_SUM,
                      MPI_COMM_WORLD);
        MPI_Allreduce(MPI_IN_PLACE, binEField[i].getArrayPointer(), 3,
                      MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      }
      if (outputMask_[ACTIVITY]) {
        MPI_Allreduce(MPI_IN_PLACE, &binTypeCounts[i][0], outputTypes_.size(),
                      MPI_INT, MPI_SUM, MPI_COMM_WORLD);
      }
    }
#endif

    Vector3d omega;
    RealType z, r, temp, binVolume, den(0.0), dz(0.0);
    std::vector<RealType> nden(outputTypes_.size(), 0.0);
    RealType boxVolume = currentSnap_->getVolume();
    RealType ePot(0.0);

    for (unsigned int i = 0; i < nBins_; i++) {
      if (usePeriodicBoundaryConditions_) {
        z = (((RealType)i + 0.5) / (RealType)nBins_) *
            hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_);
        data_[Z].accumulator[i]->add(z);

        binVolume = boxVolume / nBins_;
        dz        = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) /
             (RealType)nBins_;
      } else {
        r = (((RealType)i + 0.5) * binWidth_);
        data_[R].accumulator[i]->add(r);

        RealType rinner = (RealType)i * binWidth_;
        RealType router = (RealType)(i + 1) * binWidth_;
        binVolume =
            (4.0 * Constants::PI * (pow(router, 3) - pow(rinner, 3))) / 3.0;
      }

      // The calculations of the following properties are done regardless
      //   of whether or not the selected species are present in the bin
      if (outputMask_[ELECTRICFIELD] && binEFieldCount[i] > 0) {
        eField = binEField[i] / RealType(binEFieldCount[i]);
        data_[ELECTRICFIELD].accumulator[i]->add(eField);
      }

      if (outputMask_[ELECTROSTATICPOTENTIAL]) {
        if (usePeriodicBoundaryConditions_ && binEFieldCount[i] > 0) {
          ePot += eField[rnemdPrivilegedAxis_] * dz;
          data_[ELECTROSTATICPOTENTIAL].accumulator[i]->add(ePot);
        }
      }

      // For the following properties, zero should be added if the selected
      //   species is not present in the bin
      if (outputMask_[DENSITY]) {
        den = binMass[i] * Constants::densityConvert / binVolume;
        data_[DENSITY].accumulator[i]->add(den);
      }

      if (outputMask_[ACTIVITY]) {
        for (unsigned int j = 0; j < outputTypes_.size(); j++) {
          nden[j] = (binTypeCounts[i][j] / binVolume) *
                    Constants::concentrationConvert;
        }
        data_[ACTIVITY].accumulator[i]->add(nden);
      }

      if (binCount[i] > 0) {
        // The calculations of the following properties are meaningless if
        //   the selected species is not found in the bin
        if (outputMask_[VELOCITY]) {
          vel = binP[i] / binMass[i];
          data_[VELOCITY].accumulator[i]->add(vel);
        }

        if (outputMask_[ANGULARVELOCITY]) {
          omega = binI[i].inverse() * binL[i];
          data_[ANGULARVELOCITY].accumulator[i]->add(omega);
        }

        if (outputMask_[TEMPERATURE]) {
          if (binDOF[i] > 0) {
            temp = 2.0 * binKE[i] /
                   (binDOF[i] * Constants::kb * Constants::energyConvert);
            data_[TEMPERATURE].accumulator[i]->add(temp);
          } else {
            std::cerr << "No degrees of freedom in this bin?\n";
          }
        }
      }
    }

    hasData_ = true;
  }